

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O2

void __thiscall gl4cts::DirectStateAccess::Samplers::DefaultsTest::clean(DefaultsTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_sampler_dsa != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x468))(1,&this->m_sampler_dsa);
    this->m_sampler_dsa = 0;
  }
  return;
}

Assistant:

void DefaultsTest::clean()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_sampler_dsa)
	{
		gl.deleteSamplers(1, &m_sampler_dsa);

		m_sampler_dsa = 0;
	}
}